

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cc
# Opt level: O1

int __thiscall Composite::traverse(Composite *this)

{
  int iVar1;
  int iVar2;
  pointer ppCVar3;
  ulong uVar4;
  
  ppCVar3 = (this->children).super__Vector_base<Component_*,_std::allocator<Component_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->children).super__Vector_base<Component_*,_std::allocator<Component_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    uVar4 = 0;
    do {
      iVar1 = this->value;
      iVar2 = (**ppCVar3[uVar4]->_vptr_Component)();
      this->value = iVar2 + iVar1;
      uVar4 = uVar4 + 1;
      ppCVar3 = (this->children).super__Vector_base<Component_*,_std::allocator<Component_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->children).
                                   super__Vector_base<Component_*,_std::allocator<Component_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3));
  }
  return this->value;
}

Assistant:

int traverse() {
    for (int i = 0; i < children.size(); i++) {
      value = value + children[i]->traverse();
    }
    return value;
  }